

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void mdisplay(double *A,int row,int col)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  printf("\n MATRIX Order : %d X %d \n \n");
  uVar2 = 0;
  if (0 < col) {
    uVar2 = (ulong)(uint)col;
  }
  uVar3 = (ulong)(uint)row;
  if (row < 1) {
    uVar3 = 0;
  }
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    printf("R%d: ",uVar4 & 0xffffffff);
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      printf("%g ",A[uVar1]);
    }
    printf(":R%d \n",uVar4 & 0xffffffff);
    A = A + col;
  }
  return;
}

Assistant:

void mdisplay(double *A, int row, int col) {
	int i,j;
	printf("\n MATRIX Order : %d X %d \n \n",row,col);
	
	for (i = 0; i < row; i++) {
		printf("R%d: ",i);
		for ( j = 0; j < col;j++) {
			printf("%g ",A[i*col + j]);
		}
		printf(":R%d \n",i);
	}
}